

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_path.c
# Opt level: O2

char * zt_find_basedir(char *path,char *trigger)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  ssize_t sVar4;
  char *__s;
  stat sbuf;
  char lpath [4097];
  char cpath [4097];
  
  sVar2 = strlen(path);
  memset(lpath,0,0x1001);
  if (0x1000 < sVar2) {
    sVar2 = 0x1001;
  }
  memcpy(lpath,path,sVar2);
  while( true ) {
    memset(cpath,0,0x1001);
    snprintf(cpath,0x1001,"%s%s%s",lpath,"/",trigger);
    piVar3 = __errno_location();
    *piVar3 = 0;
    iVar1 = stat(cpath,(stat *)&sbuf);
    if (iVar1 == 0) {
      sVar2 = strlen(lpath);
      __s = (char *)zt_calloc_p(sVar2 + 2,1);
      snprintf(__s,sVar2 + 2,"%s%s",lpath,"/");
      return __s;
    }
    if (lpath[0] == '\0') break;
    sVar4 = zt_cstr_rfind(lpath,0,-1,"/");
    if (sVar4 == -1) {
      return (char *)0x0;
    }
    lpath[sVar4] = '\0';
  }
  return (char *)0x0;
}

Assistant:

char *zt_find_basedir(const char * path, const char * trigger) {
    struct stat sbuf;
    size_t      len;
    ssize_t     offt;
    char      * result = NULL;
    char        cpath[PATH_MAX + 1];
    char        lpath[PATH_MAX + 1];

    len = strlen(path);
    memset(lpath, 0, sizeof(lpath));
    memcpy(lpath, path, MIN(len, sizeof(cpath)));

    do {
        memset(cpath, 0, sizeof(cpath));
        snprintf(cpath, sizeof(cpath), "%s%s%s", lpath, PATH_SEPERATOR, trigger);
        errno = 0;
        if (stat(cpath, &sbuf) == 0) {
            /* found it */
            len    = strlen(lpath) + strlen(PATH_SEPERATOR) + 1;
            result = zt_callocs(sizeof(char), len);
            snprintf(result, len, "%s%s", lpath, PATH_SEPERATOR);
            break;
        }

        if ((strlen(lpath) == 0) ||
            (offt = zt_cstr_rfind(lpath, 0, -1, PATH_SEPERATOR)) == -1) {
            break;
        }
        lpath[offt] = '\0';
    } while (1);

    return result;
}